

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  int *piVar4;
  float *pfVar5;
  float *pfVar6;
  int *piVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  undefined8 *puVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar26;
  int iVar27;
  int iVar28;
  Geometry *pGVar29;
  long lVar30;
  long lVar31;
  RTCIntersectArguments *pRVar32;
  RTCRayQueryContext *pRVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 (*pauVar40) [16];
  Scene *pSVar41;
  int iVar42;
  AABBNodeMB4D *node1;
  ulong uVar43;
  ulong uVar44;
  RayHit *pRVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  undefined4 uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  float *vertices;
  ulong uVar55;
  long lVar56;
  RayHit *pRVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  float fVar82;
  float fVar83;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar96;
  float fVar98;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar97;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar95 [16];
  float fVar102;
  float fVar103;
  float fVar113;
  float fVar115;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar119;
  float fVar124;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar125;
  float fVar129;
  float fVar130;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar131;
  undefined1 auVar128 [16];
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar133 [16];
  float fVar137;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  Scene *scene;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1291;
  ulong local_1290;
  undefined1 local_1288 [8];
  float fStack_1280;
  float fStack_127c;
  Intersectors *local_1278;
  ulong local_1270;
  float local_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  undefined1 local_124c [20];
  float local_1238;
  float fStack_1234;
  undefined4 uStack_1230;
  float fStack_122c;
  undefined1 local_1228 [16];
  RTCFilterFunctionNArguments local_1218;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  undefined8 local_11a8;
  ulong local_11a0;
  ulong local_1198;
  ulong local_1190;
  ulong local_1188;
  undefined1 (*local_1180) [16];
  RayHit *local_1178;
  long local_1170;
  Scene *local_1168;
  long local_1160;
  float local_1158;
  float local_1154;
  undefined4 local_1150;
  undefined4 local_114c;
  undefined4 local_1148;
  undefined4 local_1144;
  uint local_1140;
  uint local_113c;
  uint local_1138;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined1 local_10f8 [12];
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [16];
  undefined1 *local_10c8;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  float local_1088 [4];
  float local_1078 [4];
  float local_1068 [4];
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  uint local_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_1180 = (undefined1 (*) [16])local_f68;
      local_1028 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1038 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_fe8 = (ray->super_RayK<1>).org.field_0.m128[2];
      aVar26 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar70 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar131 = 0.0;
      if (0.0 <= fVar70) {
        fVar131 = fVar70;
      }
      fVar70 = (ray->super_RayK<1>).tfar;
      fVar152 = 0.0;
      if (0.0 <= fVar70) {
        fVar152 = fVar70;
      }
      uVar58 = -(uint)(1e-18 <= ABS(aVar26.x));
      uVar59 = -(uint)(1e-18 <= ABS(aVar26.y));
      uVar62 = -(uint)(1e-18 <= ABS(aVar26.z));
      uVar66 = -(uint)(1e-18 <= ABS(aVar26.field_3.w));
      auVar92 = divps(_DAT_01feca10,(undefined1  [16])aVar26);
      auVar85._0_4_ = auVar92._0_4_ & uVar58;
      auVar85._4_4_ = auVar92._4_4_ & uVar59;
      auVar85._8_4_ = auVar92._8_4_ & uVar62;
      auVar85._12_4_ = auVar92._12_4_ & uVar66;
      auVar92._0_8_ = CONCAT44(~uVar59,~uVar58) & 0x5d5e0b6b5d5e0b6b;
      auVar92._8_4_ = ~uVar62 & 0x5d5e0b6b;
      auVar92._12_4_ = ~uVar66 & 0x5d5e0b6b;
      auVar92 = auVar92 | auVar85;
      local_1048 = auVar92._0_4_ * 0.99999964;
      local_1118 = auVar92._4_4_ * 0.99999964;
      local_1018 = auVar92._8_4_ * 0.99999964;
      local_1128 = auVar92._0_4_ * 1.0000004;
      local_11e8 = auVar92._4_4_ * 1.0000004;
      local_1008 = auVar92._8_4_ * 1.0000004;
      local_1188 = (ulong)(local_1048 < 0.0) << 4;
      local_1190 = (ulong)(local_1118 < 0.0) << 4 | 0x20;
      local_1198 = (ulong)(local_1018 < 0.0) << 4 | 0x40;
      local_1270 = local_1198 ^ 0x10;
      local_ff8._4_4_ = fVar131;
      local_ff8._0_4_ = fVar131;
      local_ff8._8_4_ = fVar131;
      local_ff8._12_4_ = fVar131;
      auVar139._4_4_ = fVar152;
      auVar139._0_4_ = fVar152;
      auVar139._8_4_ = fVar152;
      auVar139._12_4_ = fVar152;
      _local_fd8 = mm_lookupmask_ps._240_8_;
      _uStack_fd0 = mm_lookupmask_ps._248_8_;
      local_1178 = ray;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1114 = local_1118;
      fStack_1110 = local_1118;
      fStack_110c = local_1118;
      fStack_1124 = local_1128;
      fStack_1120 = local_1128;
      fStack_111c = local_1128;
      fStack_11e4 = local_11e8;
      fStack_11e0 = local_11e8;
      fStack_11dc = local_11e8;
      local_11a0 = local_1188 ^ 0x10;
      local_11a8 = local_1190 ^ 0x10;
      uVar44 = local_1190;
      uVar46 = local_1190 ^ 0x10;
      uVar47 = local_1270;
      uVar48 = local_1188;
      uVar49 = local_1198;
      uVar51 = local_1188 ^ 0x10;
      auVar92 = local_ff8;
      fVar70 = local_1018;
      fVar131 = local_1018;
      fVar152 = local_1018;
      fVar148 = local_1018;
      fVar102 = local_1028;
      fVar77 = local_1028;
      fVar82 = local_1028;
      fVar83 = local_1028;
      fVar84 = local_1038;
      fVar90 = local_1038;
      fVar91 = local_1038;
      fVar96 = local_1038;
      fVar97 = local_1048;
      fVar98 = local_1048;
      fVar99 = local_1048;
      fVar100 = local_1048;
      fVar101 = local_11e8;
      fVar103 = local_11e8;
      fVar113 = local_11e8;
      fVar114 = local_11e8;
      fVar115 = local_1118;
      fVar116 = local_1118;
      fVar117 = local_1118;
      fVar118 = local_1118;
      fVar119 = local_1128;
      fVar124 = local_1128;
      fVar125 = local_1128;
      fVar129 = local_1128;
      fVar130 = local_fe8;
      fVar132 = local_fe8;
      fVar134 = local_fe8;
      fVar135 = local_fe8;
      fVar136 = local_1008;
      fVar137 = local_1008;
      fVar141 = local_1008;
      fVar142 = local_1008;
      do {
        do {
          do {
            if (local_1180 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar40 = local_1180 + -1;
            local_1180 = local_1180 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar40 + 8));
          local_1290 = *(ulong *)*local_1180;
          do {
            if ((local_1290 & 8) == 0) {
              fVar143 = (ray->super_RayK<1>).dir.field_0.m128[3];
              uVar43 = local_1290 & 0xfffffffffffffff0;
              pfVar23 = (float *)(uVar43 + 0x80 + uVar48);
              pfVar21 = (float *)(uVar43 + 0x20 + uVar48);
              auVar104._0_4_ = ((*pfVar23 * fVar143 + *pfVar21) - fVar102) * fVar97;
              auVar104._4_4_ = ((pfVar23[1] * fVar143 + pfVar21[1]) - fVar77) * fVar98;
              auVar104._8_4_ = ((pfVar23[2] * fVar143 + pfVar21[2]) - fVar82) * fVar99;
              auVar104._12_4_ = ((pfVar23[3] * fVar143 + pfVar21[3]) - fVar83) * fVar100;
              pfVar23 = (float *)(uVar43 + 0x80 + uVar44);
              pfVar21 = (float *)(uVar43 + 0x20 + uVar44);
              auVar85 = maxps(auVar92,auVar104);
              auVar127._0_4_ = ((*pfVar23 * fVar143 + *pfVar21) - fVar84) * fVar115;
              auVar127._4_4_ = ((pfVar23[1] * fVar143 + pfVar21[1]) - fVar90) * fVar116;
              auVar127._8_4_ = ((pfVar23[2] * fVar143 + pfVar21[2]) - fVar91) * fVar117;
              auVar127._12_4_ = ((pfVar23[3] * fVar143 + pfVar21[3]) - fVar96) * fVar118;
              pfVar23 = (float *)(uVar43 + 0x80 + uVar49);
              pfVar21 = (float *)(uVar43 + 0x20 + uVar49);
              auVar109._0_4_ = ((*pfVar23 * fVar143 + *pfVar21) - fVar130) * fVar70;
              auVar109._4_4_ = ((pfVar23[1] * fVar143 + pfVar21[1]) - fVar132) * fVar131;
              auVar109._8_4_ = ((pfVar23[2] * fVar143 + pfVar21[2]) - fVar134) * fVar152;
              auVar109._12_4_ = ((pfVar23[3] * fVar143 + pfVar21[3]) - fVar135) * fVar148;
              auVar104 = maxps(auVar127,auVar109);
              _local_10f8 = maxps(auVar85,auVar104);
              pfVar24 = (float *)(uVar43 + 0x80 + uVar51);
              pfVar21 = (float *)(uVar43 + 0x20 + uVar51);
              pfVar25 = (float *)(uVar43 + 0x80 + uVar46);
              pfVar23 = (float *)(uVar43 + 0x20 + uVar46);
              auVar105._0_4_ = ((*pfVar24 * fVar143 + *pfVar21) - fVar102) * fVar119;
              auVar105._4_4_ = ((pfVar24[1] * fVar143 + pfVar21[1]) - fVar77) * fVar124;
              auVar105._8_4_ = ((pfVar24[2] * fVar143 + pfVar21[2]) - fVar82) * fVar125;
              auVar105._12_4_ = ((pfVar24[3] * fVar143 + pfVar21[3]) - fVar83) * fVar129;
              auVar120._0_4_ = ((*pfVar25 * fVar143 + *pfVar23) - fVar84) * fVar101;
              auVar120._4_4_ = ((pfVar25[1] * fVar143 + pfVar23[1]) - fVar90) * fVar103;
              auVar120._8_4_ = ((pfVar25[2] * fVar143 + pfVar23[2]) - fVar91) * fVar113;
              auVar120._12_4_ = ((pfVar25[3] * fVar143 + pfVar23[3]) - fVar96) * fVar114;
              pfVar23 = (float *)(uVar43 + 0x80 + uVar47);
              pfVar21 = (float *)(uVar43 + 0x20 + uVar47);
              auVar122._0_4_ = ((*pfVar23 * fVar143 + *pfVar21) - fVar130) * fVar136;
              auVar122._4_4_ = ((pfVar23[1] * fVar143 + pfVar21[1]) - fVar132) * fVar137;
              auVar122._8_4_ = ((pfVar23[2] * fVar143 + pfVar21[2]) - fVar134) * fVar141;
              auVar122._12_4_ = ((pfVar23[3] * fVar143 + pfVar21[3]) - fVar135) * fVar142;
              auVar104 = minps(auVar120,auVar122);
              auVar85 = minps(auVar139,auVar105);
              auVar85 = minps(auVar85,auVar104);
              if (((uint)local_1290 & 7) == 6) {
                bVar34 = (fVar143 < *(float *)(uVar43 + 0xf0) &&
                         *(float *)(uVar43 + 0xe0) <= fVar143) && local_10f8._0_4_ <= auVar85._0_4_;
                bVar35 = (fVar143 < *(float *)(uVar43 + 0xf4) &&
                         *(float *)(uVar43 + 0xe4) <= fVar143) && local_10f8._4_4_ <= auVar85._4_4_;
                bVar36 = (fVar143 < *(float *)(uVar43 + 0xf8) &&
                         *(float *)(uVar43 + 0xe8) <= fVar143) && local_10f8._8_4_ <= auVar85._8_4_;
                bVar37 = (fVar143 < *(float *)(uVar43 + 0xfc) &&
                         *(float *)(uVar43 + 0xec) <= fVar143) &&
                         local_10f8._12_4_ <= auVar85._12_4_;
              }
              else {
                bVar34 = local_10f8._0_4_ <= auVar85._0_4_;
                bVar35 = local_10f8._4_4_ <= auVar85._4_4_;
                bVar36 = local_10f8._8_4_ <= auVar85._8_4_;
                bVar37 = local_10f8._12_4_ <= auVar85._12_4_;
              }
              auVar78._0_4_ = (uint)bVar34 * -0x80000000;
              auVar78._4_4_ = (uint)bVar35 * -0x80000000;
              auVar78._8_4_ = (uint)bVar36 * -0x80000000;
              auVar78._12_4_ = (uint)bVar37 * -0x80000000;
              uVar50 = movmskps((int)This,auVar78);
              This = (Intersectors *)CONCAT44((int)((ulong)This >> 0x20),uVar50);
            }
            if ((local_1290 & 8) == 0) {
              if (This == (Intersectors *)0x0) {
                iVar42 = 4;
              }
              else {
                uVar43 = local_1290 & 0xfffffffffffffff0;
                lVar56 = 0;
                if (This != (Intersectors *)0x0) {
                  for (; ((ulong)This >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
                  }
                }
                iVar42 = 0;
                local_1290 = *(ulong *)(uVar43 + lVar56 * 8);
                uVar52 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
                if (uVar52 != 0) {
                  uVar58 = *(uint *)(local_10f8 + lVar56 * 4);
                  lVar56 = 0;
                  if (uVar52 != 0) {
                    for (; (uVar52 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
                    }
                  }
                  uVar53 = *(ulong *)(uVar43 + lVar56 * 8);
                  uVar59 = *(uint *)(local_10f8 + lVar56 * 4);
                  uVar52 = uVar52 - 1 & uVar52;
                  uVar47 = local_1270;
                  if (uVar52 == 0) {
                    if (uVar58 < uVar59) {
                      *(ulong *)*local_1180 = uVar53;
                      *(uint *)((long)*local_1180 + 8) = uVar59;
                      local_1180 = local_1180 + 1;
                    }
                    else {
                      *(ulong *)*local_1180 = local_1290;
                      *(uint *)((long)*local_1180 + 8) = uVar58;
                      local_1290 = uVar53;
                      local_1180 = local_1180 + 1;
                    }
                  }
                  else {
                    auVar79._8_4_ = uVar58;
                    auVar79._0_8_ = local_1290;
                    auVar79._12_4_ = 0;
                    auVar86._8_4_ = uVar59;
                    auVar86._0_8_ = uVar53;
                    auVar86._12_4_ = 0;
                    lVar56 = 0;
                    if (uVar52 != 0) {
                      for (; (uVar52 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
                      }
                    }
                    uVar53 = *(ulong *)(uVar43 + lVar56 * 8);
                    iVar27 = *(int *)(local_10f8 + lVar56 * 4);
                    auVar93._8_4_ = iVar27;
                    auVar93._0_8_ = uVar53;
                    auVar93._12_4_ = 0;
                    auVar106._8_4_ = -(uint)((int)uVar58 < (int)uVar59);
                    uVar52 = uVar52 - 1 & uVar52;
                    fVar101 = local_11e8;
                    fVar103 = fStack_11e4;
                    fVar113 = fStack_11e0;
                    fVar114 = fStack_11dc;
                    if (uVar52 == 0) {
                      auVar106._4_4_ = auVar106._8_4_;
                      auVar106._0_4_ = auVar106._8_4_;
                      auVar106._12_4_ = auVar106._8_4_;
                      auVar85 = auVar79 & auVar106 | ~auVar106 & auVar86;
                      auVar104 = auVar86 & auVar106 | ~auVar106 & auVar79;
                      auVar107._8_4_ = -(uint)(auVar85._8_4_ < iVar27);
                      auVar107._0_8_ = CONCAT44(auVar107._8_4_,auVar107._8_4_);
                      auVar107._12_4_ = auVar107._8_4_;
                      local_1290 = ~auVar107._0_8_ & uVar53 | auVar85._0_8_ & auVar107._0_8_;
                      auVar85 = auVar93 & auVar107 | ~auVar107 & auVar85;
                      auVar80._8_4_ = -(uint)(auVar104._8_4_ < auVar85._8_4_);
                      auVar80._4_4_ = auVar80._8_4_;
                      auVar80._0_4_ = auVar80._8_4_;
                      auVar80._12_4_ = auVar80._8_4_;
                      *local_1180 = ~auVar80 & auVar104 | auVar85 & auVar80;
                      local_1180[1] = auVar104 & auVar80 | ~auVar80 & auVar85;
                      local_1180 = local_1180 + 2;
                    }
                    else {
                      lVar56 = 0;
                      if (uVar52 != 0) {
                        for (; (uVar52 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
                        }
                      }
                      iVar28 = *(int *)(local_10f8 + lVar56 * 4);
                      auVar121._8_4_ = iVar28;
                      auVar121._0_8_ = *(undefined8 *)(uVar43 + lVar56 * 8);
                      auVar121._12_4_ = 0;
                      auVar108._4_4_ = auVar106._8_4_;
                      auVar108._0_4_ = auVar106._8_4_;
                      auVar108._8_4_ = auVar106._8_4_;
                      auVar108._12_4_ = auVar106._8_4_;
                      auVar85 = auVar79 & auVar108 | ~auVar108 & auVar86;
                      auVar104 = auVar86 & auVar108 | ~auVar108 & auVar79;
                      auVar126._0_4_ = -(uint)(iVar27 < iVar28);
                      auVar126._4_4_ = -(uint)(iVar27 < iVar28);
                      auVar126._8_4_ = -(uint)(iVar27 < iVar28);
                      auVar126._12_4_ = -(uint)(iVar27 < iVar28);
                      auVar109 = auVar93 & auVar126 | ~auVar126 & auVar121;
                      auVar127 = ~auVar126 & auVar93 | auVar121 & auVar126;
                      auVar94._8_4_ = -(uint)(auVar104._8_4_ < auVar127._8_4_);
                      auVar94._4_4_ = auVar94._8_4_;
                      auVar94._0_4_ = auVar94._8_4_;
                      auVar94._12_4_ = auVar94._8_4_;
                      auVar122 = auVar104 & auVar94 | ~auVar94 & auVar127;
                      auVar87._8_4_ = -(uint)(auVar85._8_4_ < auVar109._8_4_);
                      auVar87._0_8_ = CONCAT44(auVar87._8_4_,auVar87._8_4_);
                      auVar87._12_4_ = auVar87._8_4_;
                      local_1290 = auVar85._0_8_ & auVar87._0_8_ | ~auVar87._0_8_ & auVar109._0_8_;
                      auVar85 = ~auVar87 & auVar85 | auVar109 & auVar87;
                      auVar81._8_4_ = -(uint)(auVar85._8_4_ < auVar122._8_4_);
                      auVar81._4_4_ = auVar81._8_4_;
                      auVar81._0_4_ = auVar81._8_4_;
                      auVar81._12_4_ = auVar81._8_4_;
                      *local_1180 = ~auVar94 & auVar104 | auVar127 & auVar94;
                      local_1180[1] = ~auVar81 & auVar85 | auVar122 & auVar81;
                      local_1180[2] = auVar85 & auVar81 | ~auVar81 & auVar122;
                      local_1180 = local_1180 + 3;
                      fVar115 = local_1118;
                      fVar116 = fStack_1114;
                      fVar117 = fStack_1110;
                      fVar118 = fStack_110c;
                      fVar119 = local_1128;
                      fVar124 = fStack_1124;
                      fVar125 = fStack_1120;
                      fVar129 = fStack_111c;
                    }
                  }
                }
              }
            }
            else {
              iVar42 = 6;
            }
          } while (iVar42 == 0);
        } while (iVar42 != 6);
        local_1170 = (ulong)((uint)local_1290 & 0xf) - 8;
        local_1278 = This;
        if (local_1170 != 0) {
          local_1290 = local_1290 & 0xfffffffffffffff0;
          local_1160 = 0;
          do {
            lVar56 = local_1160 * 0x50;
            local_1168 = context->scene;
            pGVar29 = (local_1168->geometries).items[*(uint *)(local_1290 + 0x30 + lVar56)].ptr;
            local_1268 = pGVar29->fnumTimeSegments;
            fVar70 = (pGVar29->time_range).lower;
            fVar70 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar70) /
                     ((pGVar29->time_range).upper - fVar70)) * local_1268;
            _local_1288 = ZEXT416((uint)fVar70);
            fVar70 = floorf(fVar70);
            pSVar41 = local_1168;
            ray = local_1178;
            if (local_1268 + -1.0 <= fVar70) {
              fVar70 = local_1268 + -1.0;
            }
            fVar131 = 0.0;
            if (0.0 <= fVar70) {
              fVar131 = fVar70;
            }
            uVar54 = (ulong)*(uint *)(local_1290 + 4 + lVar56);
            lVar30 = *(long *)(*(long *)&pGVar29[2].numPrimitives + (long)(int)fVar131 * 0x38);
            lVar31 = *(long *)(*(long *)&pGVar29[2].numPrimitives + 0x38 + (long)(int)fVar131 * 0x38
                              );
            pfVar21 = (float *)(lVar30 + (ulong)*(uint *)(local_1290 + lVar56) * 4);
            uVar55 = (ulong)*(uint *)(local_1290 + 0x10 + lVar56);
            pfVar23 = (float *)(lVar30 + uVar55 * 4);
            uVar44 = (ulong)*(uint *)(local_1290 + 0x20 + lVar56);
            pfVar24 = (float *)(lVar30 + uVar44 * 4);
            pfVar25 = (float *)(lVar30 + uVar54 * 4);
            uVar51 = (ulong)*(uint *)(local_1290 + 0x14 + lVar56);
            pfVar1 = (float *)(lVar30 + uVar51 * 4);
            uVar46 = (ulong)*(uint *)(local_1290 + 0x24 + lVar56);
            pfVar2 = (float *)(lVar30 + uVar46 * 4);
            uVar47 = (ulong)*(uint *)(local_1290 + 8 + lVar56);
            pfVar3 = (float *)(lVar30 + uVar47 * 4);
            uVar53 = (ulong)*(uint *)(local_1290 + 0x18 + lVar56);
            piVar4 = (int *)(lVar30 + uVar53 * 4);
            uVar49 = (ulong)*(uint *)(local_1290 + 0x28 + lVar56);
            pfVar5 = (float *)(lVar30 + uVar49 * 4);
            uVar48 = (ulong)*(uint *)(local_1290 + 0xc + lVar56);
            pfVar6 = (float *)(lVar30 + uVar48 * 4);
            uVar52 = (ulong)*(uint *)(local_1290 + 0x1c + lVar56);
            piVar7 = (int *)(lVar30 + uVar52 * 4);
            uVar43 = (ulong)*(uint *)(local_1290 + 0x2c + lVar56);
            pfVar8 = (float *)(lVar30 + uVar43 * 4);
            pfVar9 = (float *)(lVar31 + (ulong)*(uint *)(local_1290 + lVar56) * 4);
            pfVar10 = (float *)(lVar31 + uVar55 * 4);
            local_1288._0_4_ = (float)local_1288._0_4_ - fVar131;
            pfVar11 = (float *)(lVar31 + uVar54 * 4);
            local_11a8 = CONCAT44(pfVar6[2],pfVar3[2]);
            pfVar12 = (float *)(lVar31 + uVar47 * 4);
            local_1228._4_4_ = *piVar7;
            local_1228._0_4_ = *piVar4;
            pfVar13 = (float *)(lVar31 + uVar48 * 4);
            pfVar14 = (float *)(lVar31 + uVar53 * 4);
            pfVar15 = (float *)(lVar31 + uVar51 * 4);
            pfVar16 = (float *)(lVar31 + uVar52 * 4);
            pfVar17 = (float *)(lVar31 + uVar44 * 4);
            pfVar18 = (float *)(lVar31 + uVar49 * 4);
            pfVar19 = (float *)(lVar31 + uVar46 * 4);
            pfVar20 = (float *)(lVar31 + uVar43 * 4);
            fVar148 = 1.0 - (float)local_1288._0_4_;
            puVar22 = (undefined8 *)(local_1290 + 0x30 + lVar56);
            local_f88 = *puVar22;
            uStack_f80 = puVar22[1];
            puVar22 = (undefined8 *)(local_1290 + 0x40 + lVar56);
            local_1108 = *puVar22;
            uStack_1100 = puVar22[1];
            fVar70 = (local_1178->super_RayK<1>).org.field_0.m128[0];
            fVar131 = (local_1178->super_RayK<1>).org.field_0.m128[1];
            fVar152 = (local_1178->super_RayK<1>).org.field_0.m128[2];
            fVar90 = (*pfVar21 * fVar148 + *pfVar9 * (float)local_1288._0_4_) - fVar70;
            fVar96 = (*pfVar25 * fVar148 + *pfVar11 * (float)local_1288._0_4_) - fVar70;
            fVar98 = (*pfVar3 * fVar148 + *pfVar12 * (float)local_1288._0_4_) - fVar70;
            fVar100 = (*pfVar6 * fVar148 + *pfVar13 * (float)local_1288._0_4_) - fVar70;
            local_11c8 = (pfVar21[1] * fVar148 + pfVar9[1] * (float)local_1288._0_4_) - fVar131;
            fStack_11c4 = (pfVar25[1] * fVar148 + pfVar11[1] * (float)local_1288._0_4_) - fVar131;
            fStack_11c0 = (pfVar3[1] * fVar148 + pfVar12[1] * (float)local_1288._0_4_) - fVar131;
            fStack_11bc = (pfVar6[1] * fVar148 + pfVar13[1] * (float)local_1288._0_4_) - fVar131;
            fVar164 = (pfVar21[2] * fVar148 + pfVar9[2] * (float)local_1288._0_4_) - fVar152;
            fVar166 = (pfVar25[2] * fVar148 + pfVar11[2] * (float)local_1288._0_4_) - fVar152;
            fStack_11b0 = (fStack_11b0 * fVar148 + pfVar12[2] * (float)local_1288._0_4_) - fVar152;
            fStack_11ac = (fStack_11ac * fVar148 + pfVar13[2] * (float)local_1288._0_4_) - fVar152;
            fVar102 = (*pfVar23 * fVar148 + *pfVar10 * (float)local_1288._0_4_) - fVar70;
            fVar113 = (*pfVar1 * fVar148 + *pfVar15 * (float)local_1288._0_4_) - fVar70;
            fVar115 = ((float)uStack_1230 * fVar148 + *pfVar14 * (float)local_1288._0_4_) - fVar70;
            fVar117 = (fStack_122c * fVar148 + *pfVar16 * (float)local_1288._0_4_) - fVar70;
            fVar137 = (pfVar23[1] * fVar148 + pfVar10[1] * (float)local_1288._0_4_) - fVar131;
            fVar141 = (pfVar1[1] * fVar148 + pfVar15[1] * (float)local_1288._0_4_) - fVar131;
            fVar142 = ((float)piVar4[1] * fVar148 + pfVar14[1] * (float)local_1288._0_4_) - fVar131;
            fVar143 = ((float)piVar7[1] * fVar148 + pfVar16[1] * (float)local_1288._0_4_) - fVar131;
            fVar153 = (pfVar23[2] * fVar148 + pfVar10[2] * (float)local_1288._0_4_) - fVar152;
            fVar155 = (pfVar1[2] * fVar148 + pfVar15[2] * (float)local_1288._0_4_) - fVar152;
            fVar157 = ((float)piVar4[2] * fVar148 + pfVar14[2] * (float)local_1288._0_4_) - fVar152;
            fVar159 = ((float)piVar7[2] * fVar148 + pfVar16[2] * (float)local_1288._0_4_) - fVar152;
            fVar161 = (*pfVar24 * fVar148 + *pfVar17 * (float)local_1288._0_4_) - fVar70;
            fVar162 = (*pfVar2 * fVar148 + *pfVar19 * (float)local_1288._0_4_) - fVar70;
            fVar163 = (*pfVar5 * fVar148 + *pfVar18 * (float)local_1288._0_4_) - fVar70;
            fVar70 = (*pfVar8 * fVar148 + *pfVar20 * (float)local_1288._0_4_) - fVar70;
            fVar125 = (pfVar24[1] * fVar148 + pfVar17[1] * (float)local_1288._0_4_) - fVar131;
            fVar129 = (pfVar2[1] * fVar148 + pfVar19[1] * (float)local_1288._0_4_) - fVar131;
            fVar130 = (pfVar5[1] * fVar148 + pfVar18[1] * (float)local_1288._0_4_) - fVar131;
            fVar131 = (pfVar8[1] * fVar148 + pfVar20[1] * (float)local_1288._0_4_) - fVar131;
            fVar149 = (fVar148 * pfVar24[2] + (float)local_1288._0_4_ * pfVar17[2]) - fVar152;
            fVar150 = (fVar148 * pfVar2[2] + (float)local_1288._0_4_ * pfVar19[2]) - fVar152;
            fVar151 = (fVar148 * pfVar5[2] + (float)local_1288._0_4_ * pfVar18[2]) - fVar152;
            fVar152 = (fVar148 * pfVar8[2] + (float)local_1288._0_4_ * pfVar20[2]) - fVar152;
            fVar103 = fVar161 - fVar90;
            fVar114 = fVar162 - fVar96;
            fVar116 = fVar163 - fVar98;
            fVar118 = fVar70 - fVar100;
            local_fa8 = fVar125 - local_11c8;
            fStack_fa4 = fVar129 - fStack_11c4;
            fStack_fa0 = fVar130 - fStack_11c0;
            fStack_f9c = fVar131 - fStack_11bc;
            local_f98 = fVar149 - fVar164;
            fStack_f94 = fVar150 - fVar166;
            fStack_f90 = fVar151 - fStack_11b0;
            fStack_f8c = fVar152 - fStack_11ac;
            local_11d8 = fVar103;
            fStack_11d4 = fVar114;
            fStack_11d0 = fVar116;
            fStack_11cc = fVar118;
            fVar148 = (local_1178->super_RayK<1>).dir.field_0.m128[0];
            local_1268 = (local_1178->super_RayK<1>).dir.field_0.m128[1];
            fStack_1234 = (local_1178->super_RayK<1>).dir.field_0.m128[2];
            fVar119 = (local_fa8 * (fVar149 + fVar164) - local_f98 * (fVar125 + local_11c8)) *
                      fVar148 + (local_f98 * (fVar161 + fVar90) - (fVar149 + fVar164) * fVar103) *
                                local_1268 +
                                ((fVar125 + local_11c8) * fVar103 - (fVar161 + fVar90) * local_fa8)
                                * fStack_1234;
            fVar124 = (fStack_fa4 * (fVar150 + fVar166) - fStack_f94 * (fVar129 + fStack_11c4)) *
                      fVar148 + (fStack_f94 * (fVar162 + fVar96) - (fVar150 + fVar166) * fVar114) *
                                local_1268 +
                                ((fVar129 + fStack_11c4) * fVar114 - (fVar162 + fVar96) * fStack_fa4
                                ) * fStack_1234;
            local_fb8._0_8_ = CONCAT44(fVar124,fVar119);
            local_fb8._8_4_ =
                 (fStack_fa0 * (fVar151 + fStack_11b0) - fStack_f90 * (fVar130 + fStack_11c0)) *
                 fVar148 + (fStack_f90 * (fVar163 + fVar98) - (fVar151 + fStack_11b0) * fVar116) *
                           local_1268 +
                           ((fVar130 + fStack_11c0) * fVar116 - (fVar163 + fVar98) * fStack_fa0) *
                           fStack_1234;
            local_fb8._12_4_ =
                 (fStack_f9c * (fVar152 + fStack_11ac) - fStack_f8c * (fVar131 + fStack_11bc)) *
                 fVar148 + (fStack_f8c * (fVar70 + fVar100) - (fVar152 + fStack_11ac) * fVar118) *
                           local_1268 +
                           ((fVar131 + fStack_11bc) * fVar118 - (fVar70 + fVar100) * fStack_f9c) *
                           fStack_1234;
            fVar132 = local_11c8 - fVar137;
            fVar134 = fStack_11c4 - fVar141;
            fVar135 = fStack_11c0 - fVar142;
            fVar136 = fStack_11bc - fVar143;
            fVar144 = fVar164 - fVar153;
            fVar145 = fVar166 - fVar155;
            fVar146 = fStack_11b0 - fVar157;
            fVar147 = fStack_11ac - fVar159;
            _local_11b8 = CONCAT44(fVar166,fVar164);
            fVar165 = fVar90 - fVar102;
            fVar167 = fVar96 - fVar113;
            fVar168 = fVar98 - fVar115;
            fVar169 = fVar100 - fVar117;
            local_124c._4_4_ =
                 (fVar132 * (fVar164 + fVar153) - fVar144 * (local_11c8 + fVar137)) * fVar148 +
                 (fVar144 * (fVar90 + fVar102) - (fVar164 + fVar153) * fVar165) * local_1268 +
                 ((local_11c8 + fVar137) * fVar165 - (fVar90 + fVar102) * fVar132) * fStack_1234;
            local_124c._8_4_ =
                 (fVar134 * (fVar166 + fVar155) - fVar145 * (fStack_11c4 + fVar141)) * fVar148 +
                 (fVar145 * (fVar96 + fVar113) - (fVar166 + fVar155) * fVar167) * local_1268 +
                 ((fStack_11c4 + fVar141) * fVar167 - (fVar96 + fVar113) * fVar134) * fStack_1234;
            local_124c._12_4_ =
                 (fVar135 * (fStack_11b0 + fVar157) - fVar146 * (fStack_11c0 + fVar142)) * fVar148 +
                 (fVar146 * (fVar98 + fVar115) - (fStack_11b0 + fVar157) * fVar168) * local_1268 +
                 ((fStack_11c0 + fVar142) * fVar168 - (fVar98 + fVar115) * fVar135) * fStack_1234;
            local_124c._16_4_ =
                 (fVar136 * (fStack_11ac + fVar159) - fVar147 * (fStack_11bc + fVar143)) * fVar148 +
                 (fVar147 * (fVar100 + fVar117) - (fStack_11ac + fVar159) * fVar169) * local_1268 +
                 ((fStack_11bc + fVar143) * fVar169 - (fVar100 + fVar117) * fVar136) * fStack_1234;
            fVar77 = fVar102 - fVar161;
            fVar82 = fVar113 - fVar162;
            fVar83 = fVar115 - fVar163;
            fVar84 = fVar117 - fVar70;
            fVar154 = fVar137 - fVar125;
            fVar156 = fVar141 - fVar129;
            fVar158 = fVar142 - fVar130;
            fVar160 = fVar143 - fVar131;
            fVar91 = fVar153 - fVar149;
            fVar97 = fVar155 - fVar150;
            fVar99 = fVar157 - fVar151;
            fVar101 = fVar159 - fVar152;
            local_1238 = fStack_1234;
            uStack_1230 = fStack_1234;
            fStack_122c = fStack_1234;
            auVar71._0_4_ =
                 (fVar154 * (fVar149 + fVar153) - fVar91 * (fVar125 + fVar137)) * fVar148 +
                 (fVar91 * (fVar161 + fVar102) - (fVar149 + fVar153) * fVar77) * local_1268 +
                 ((fVar125 + fVar137) * fVar77 - (fVar161 + fVar102) * fVar154) * fStack_1234;
            auVar71._4_4_ =
                 (fVar156 * (fVar150 + fVar155) - fVar97 * (fVar129 + fVar141)) * fVar148 +
                 (fVar97 * (fVar162 + fVar113) - (fVar150 + fVar155) * fVar82) * local_1268 +
                 ((fVar129 + fVar141) * fVar82 - (fVar162 + fVar113) * fVar156) * fStack_1234;
            auVar71._8_4_ =
                 (fVar158 * (fVar151 + fVar157) - fVar99 * (fVar130 + fVar142)) * fVar148 +
                 (fVar99 * (fVar163 + fVar115) - (fVar151 + fVar157) * fVar83) * local_1268 +
                 ((fVar130 + fVar142) * fVar83 - (fVar163 + fVar115) * fVar158) * fStack_1234;
            auVar71._12_4_ =
                 (fVar160 * (fVar152 + fVar159) - fVar101 * (fVar131 + fVar143)) * fVar148 +
                 (fVar101 * (fVar70 + fVar117) - (fVar152 + fVar159) * fVar84) * local_1268 +
                 ((fVar131 + fVar143) * fVar84 - (fVar70 + fVar117) * fVar160) * fStack_1234;
            fVar113 = fVar119 + local_124c._4_4_ + auVar71._0_4_;
            fVar115 = fVar124 + local_124c._8_4_ + auVar71._4_4_;
            fVar117 = local_fb8._8_4_ + local_124c._12_4_ + auVar71._8_4_;
            fVar125 = local_fb8._12_4_ + local_124c._16_4_ + auVar71._12_4_;
            auVar88._8_4_ = local_fb8._8_4_;
            auVar88._0_8_ = local_fb8._0_8_;
            auVar88._12_4_ = local_fb8._12_4_;
            auVar92 = minps(auVar88,local_124c._4_16_);
            auVar92 = minps(auVar92,auVar71);
            auVar138._8_4_ = local_fb8._8_4_;
            auVar138._0_8_ = local_fb8._0_8_;
            auVar138._12_4_ = local_fb8._12_4_;
            auVar139 = maxps(auVar138,local_124c._4_16_);
            auVar139 = maxps(auVar139,auVar71);
            fVar70 = ABS(fVar113) * 1.1920929e-07;
            fVar131 = ABS(fVar115) * 1.1920929e-07;
            fVar152 = ABS(fVar117) * 1.1920929e-07;
            fVar102 = ABS(fVar125) * 1.1920929e-07;
            local_1291 = 0;
            local_10c8 = &local_1291;
            auVar140._0_4_ =
                 -(uint)(auVar139._0_4_ <= fVar70 || -fVar70 <= auVar92._0_4_) & local_fd8;
            auVar140._4_4_ =
                 -(uint)(auVar139._4_4_ <= fVar131 || -fVar131 <= auVar92._4_4_) & uStack_fd4;
            auVar140._8_4_ =
                 -(uint)(auVar139._8_4_ <= fVar152 || -fVar152 <= auVar92._8_4_) & uStack_fd0;
            auVar140._12_4_ =
                 -(uint)(auVar139._12_4_ <= fVar102 || -fVar102 <= auVar92._12_4_) & uStack_fcc;
            iVar42 = movmskps((int)&local_1291,auVar140);
            fStack_1264 = local_1268;
            fStack_1260 = local_1268;
            fStack_125c = local_1268;
            if (iVar42 != 0) {
              local_fc8 = fVar154;
              fStack_fc4 = fVar156;
              fStack_fc0 = fVar158;
              fStack_fbc = fVar160;
              local_11d8 = fVar113;
              fStack_11d4 = fVar115;
              fStack_11d0 = fVar117;
              fStack_11cc = fVar125;
              uVar58 = -(uint)(ABS(fVar144 * fVar154) <= ABS(local_f98 * fVar132));
              uVar66 = -(uint)(ABS(fVar145 * fVar156) <= ABS(fStack_f94 * fVar134));
              uVar63 = -(uint)(ABS(fVar146 * fVar158) <= ABS(fStack_f90 * fVar135));
              uVar67 = -(uint)(ABS(fVar147 * fVar160) <= ABS(fStack_f8c * fVar136));
              uVar59 = -(uint)(ABS(fVar165 * fVar91) <= ABS(fVar103 * fVar144));
              uVar60 = -(uint)(ABS(fVar167 * fVar97) <= ABS(fVar114 * fVar145));
              uVar64 = -(uint)(ABS(fVar168 * fVar99) <= ABS(fVar116 * fVar146));
              uVar68 = -(uint)(ABS(fVar169 * fVar101) <= ABS(fVar118 * fVar147));
              uVar62 = -(uint)(ABS(fVar132 * fVar77) <= ABS(local_fa8 * fVar165));
              uVar61 = -(uint)(ABS(fVar134 * fVar82) <= ABS(fStack_fa4 * fVar167));
              uVar65 = -(uint)(ABS(fVar135 * fVar83) <= ABS(fStack_fa0 * fVar168));
              uVar69 = -(uint)(ABS(fVar136 * fVar84) <= ABS(fStack_f9c * fVar169));
              auVar39._4_4_ = fVar115;
              auVar39._0_4_ = fVar113;
              auVar39._8_4_ = fVar117;
              auVar39._12_4_ = fVar125;
              fVar129 = (float)(~uVar58 & (uint)(local_fa8 * fVar144 - local_f98 * fVar132) |
                               (uint)(fVar132 * fVar91 - fVar144 * fVar154) & uVar58);
              fVar130 = (float)(~uVar66 & (uint)(fStack_fa4 * fVar145 - fStack_f94 * fVar134) |
                               (uint)(fVar134 * fVar97 - fVar145 * fVar156) & uVar66);
              fVar137 = (float)(~uVar63 & (uint)(fStack_fa0 * fVar146 - fStack_f90 * fVar135) |
                               (uint)(fVar135 * fVar99 - fVar146 * fVar158) & uVar63);
              fVar141 = (float)(~uVar67 & (uint)(fStack_f9c * fVar147 - fStack_f8c * fVar136) |
                               (uint)(fVar136 * fVar101 - fVar147 * fVar160) & uVar67);
              fVar91 = (float)(~uVar59 & (uint)(local_f98 * fVar165 - fVar103 * fVar144) |
                              (uint)(fVar144 * fVar77 - fVar165 * fVar91) & uVar59);
              fVar97 = (float)(~uVar60 & (uint)(fStack_f94 * fVar167 - fVar114 * fVar145) |
                              (uint)(fVar145 * fVar82 - fVar167 * fVar97) & uVar60);
              fVar99 = (float)(~uVar64 & (uint)(fStack_f90 * fVar168 - fVar116 * fVar146) |
                              (uint)(fVar146 * fVar83 - fVar168 * fVar99) & uVar64);
              fVar101 = (float)(~uVar68 & (uint)(fStack_f8c * fVar169 - fVar118 * fVar147) |
                               (uint)(fVar147 * fVar84 - fVar169 * fVar101) & uVar68);
              auVar123._0_4_ = ~uVar62 & (uint)(fVar103 * fVar132 - local_fa8 * fVar165);
              auVar123._4_4_ = ~uVar61 & (uint)(fVar114 * fVar134 - fStack_fa4 * fVar167);
              auVar123._8_4_ = ~uVar65 & (uint)(fVar116 * fVar135 - fStack_fa0 * fVar168);
              auVar123._12_4_ = ~uVar69 & (uint)(fVar118 * fVar136 - fStack_f9c * fVar169);
              auVar38._4_4_ = (uint)(fVar167 * fVar156 - fVar134 * fVar82) & uVar61;
              auVar38._0_4_ = (uint)(fVar165 * fVar154 - fVar132 * fVar77) & uVar62;
              auVar38._8_4_ = (uint)(fVar168 * fVar158 - fVar135 * fVar83) & uVar65;
              auVar38._12_4_ = (uint)(fVar169 * fVar160 - fVar136 * fVar84) & uVar69;
              auVar123 = auVar123 | auVar38;
              fVar70 = fVar148 * fVar129 + local_1268 * fVar91 + fStack_1234 * auVar123._0_4_;
              fVar131 = fVar148 * fVar130 + local_1268 * fVar97 + fStack_1234 * auVar123._4_4_;
              fVar152 = fVar148 * fVar137 + local_1268 * fVar99 + fStack_1234 * auVar123._8_4_;
              fVar148 = fVar148 * fVar141 + local_1268 * fVar101 + fStack_1234 * auVar123._12_4_;
              auVar110._0_4_ = fVar70 + fVar70;
              auVar110._4_4_ = fVar131 + fVar131;
              auVar110._8_4_ = fVar152 + fVar152;
              auVar110._12_4_ = fVar148 + fVar148;
              auVar72._0_4_ = fVar164 * auVar123._0_4_;
              auVar72._4_4_ = fVar166 * auVar123._4_4_;
              auVar72._8_4_ = fStack_11b0 * auVar123._8_4_;
              auVar72._12_4_ = fStack_11ac * auVar123._12_4_;
              fVar102 = fVar90 * fVar129 + local_11c8 * fVar91 + auVar72._0_4_;
              fVar77 = fVar96 * fVar130 + fStack_11c4 * fVar97 + auVar72._4_4_;
              fVar82 = fVar98 * fVar137 + fStack_11c0 * fVar99 + auVar72._8_4_;
              fVar83 = fVar100 * fVar141 + fStack_11bc * fVar101 + auVar72._12_4_;
              auVar92 = rcpps(auVar72,auVar110);
              fVar70 = auVar92._0_4_;
              fVar131 = auVar92._4_4_;
              fVar152 = auVar92._8_4_;
              fVar148 = auVar92._12_4_;
              local_1288._0_4_ =
                   ((1.0 - auVar110._0_4_ * fVar70) * fVar70 + fVar70) * (fVar102 + fVar102);
              local_1288._4_4_ =
                   ((1.0 - auVar110._4_4_ * fVar131) * fVar131 + fVar131) * (fVar77 + fVar77);
              fStack_1280 = ((1.0 - auVar110._8_4_ * fVar152) * fVar152 + fVar152) *
                            (fVar82 + fVar82);
              fStack_127c = ((1.0 - auVar110._12_4_ * fVar148) * fVar148 + fVar148) *
                            (fVar83 + fVar83);
              fVar70 = (local_1178->super_RayK<1>).tfar;
              fVar131 = (local_1178->super_RayK<1>).org.field_0.m128[3];
              auVar73._4_4_ = -(uint)(fVar131 <= (float)local_1288._4_4_);
              auVar73._0_4_ = -(uint)(fVar131 <= (float)local_1288._0_4_);
              auVar73._8_4_ = -(uint)(fVar131 <= fStack_1280);
              auVar73._12_4_ = -(uint)(fVar131 <= fStack_127c);
              auVar111._0_4_ =
                   (int)((uint)(auVar110._0_4_ != 0.0 &&
                               ((float)local_1288._0_4_ <= fVar70 &&
                               fVar131 <= (float)local_1288._0_4_)) * -0x80000000) >> 0x1f;
              auVar111._4_4_ =
                   (int)((uint)(auVar110._4_4_ != 0.0 &&
                               ((float)local_1288._4_4_ <= fVar70 &&
                               fVar131 <= (float)local_1288._4_4_)) * -0x80000000) >> 0x1f;
              auVar111._8_4_ =
                   (int)((uint)(auVar110._8_4_ != 0.0 &&
                               (fStack_1280 <= fVar70 && fVar131 <= fStack_1280)) * -0x80000000) >>
                   0x1f;
              auVar111._12_4_ =
                   (int)((uint)(auVar110._12_4_ != 0.0 &&
                               (fStack_127c <= fVar70 && fVar131 <= fStack_127c)) * -0x80000000) >>
                   0x1f;
              auVar112 = auVar111 & auVar140;
              iVar42 = movmskps(iVar42,auVar112);
              if (iVar42 != 0) {
                local_10f8._8_4_ = local_fb8._8_4_;
                local_10f8._0_8_ = local_fb8._0_8_;
                fStack_10ec = local_fb8._12_4_;
                local_10e8 = local_124c._4_4_;
                fStack_10e4 = local_124c._8_4_;
                fStack_10e0 = local_124c._12_4_;
                fStack_10dc = local_124c._16_4_;
                local_10d8 = auVar39;
                local_10c8 = &local_1291;
                local_10b8 = auVar112;
                local_1088[0] = (float)local_1288._0_4_;
                local_1088[1] = (float)local_1288._4_4_;
                local_1088[2] = fStack_1280;
                local_1088[3] = fStack_127c;
                local_1078[0] = fVar129;
                local_1078[1] = fVar130;
                local_1078[2] = fVar137;
                local_1078[3] = fVar141;
                local_1068[0] = fVar91;
                local_1068[1] = fVar97;
                local_1068[2] = fVar99;
                local_1068[3] = fVar101;
                local_1058 = auVar123;
                local_1228 = auVar112;
                auVar92 = rcpps(auVar73,auVar39);
                fVar70 = auVar92._0_4_;
                fVar131 = auVar92._4_4_;
                fVar152 = auVar92._8_4_;
                fVar148 = auVar92._12_4_;
                fVar70 = (float)(-(uint)(1e-18 <= ABS(fVar113)) &
                                (uint)(((float)DAT_01feca10 - fVar113 * fVar70) * fVar70 + fVar70));
                fVar131 = (float)(-(uint)(1e-18 <= ABS(fVar115)) &
                                 (uint)((DAT_01feca10._4_4_ - fVar115 * fVar131) * fVar131 + fVar131
                                       ));
                fVar152 = (float)(-(uint)(1e-18 <= ABS(fVar117)) &
                                 (uint)((DAT_01feca10._8_4_ - fVar117 * fVar152) * fVar152 + fVar152
                                       ));
                fVar148 = (float)(-(uint)(1e-18 <= ABS(fVar125)) &
                                 (uint)((DAT_01feca10._12_4_ - fVar125 * fVar148) * fVar148 +
                                       fVar148));
                auVar133._0_4_ = fVar119 * fVar70;
                auVar133._4_4_ = fVar124 * fVar131;
                auVar133._8_4_ = local_fb8._8_4_ * fVar152;
                auVar133._12_4_ = local_fb8._12_4_ * fVar148;
                local_10a8 = minps(auVar133,_DAT_01feca10);
                auVar128._0_4_ = fVar70 * local_124c._4_4_;
                auVar128._4_4_ = fVar131 * local_124c._8_4_;
                auVar128._8_4_ = fVar152 * local_124c._12_4_;
                auVar128._12_4_ = fVar148 * local_124c._16_4_;
                local_1098 = minps(auVar128,_DAT_01feca10);
                uVar58 = auVar112._0_4_;
                uVar59 = auVar112._4_4_;
                uVar62 = auVar112._8_4_;
                uVar66 = auVar112._12_4_;
                auVar74._0_4_ = uVar58 & local_1288._0_4_;
                auVar74._4_4_ = uVar59 & local_1288._4_4_;
                auVar74._8_4_ = uVar62 & (uint)fStack_1280;
                auVar74._12_4_ = uVar66 & (uint)fStack_127c;
                auVar95._0_8_ = CONCAT44(~uVar59,~uVar58) & 0x7f8000007f800000;
                auVar95._8_4_ = ~uVar62 & 0x7f800000;
                auVar95._12_4_ = ~uVar66 & 0x7f800000;
                auVar95 = auVar95 | auVar74;
                auVar89._4_4_ = auVar95._0_4_;
                auVar89._0_4_ = auVar95._4_4_;
                auVar89._8_4_ = auVar95._12_4_;
                auVar89._12_4_ = auVar95._8_4_;
                auVar92 = minps(auVar89,auVar95);
                auVar75._0_8_ = auVar92._8_8_;
                auVar75._8_4_ = auVar92._0_4_;
                auVar75._12_4_ = auVar92._4_4_;
                auVar92 = minps(auVar75,auVar92);
                auVar76._0_8_ =
                     CONCAT44(-(uint)(auVar92._4_4_ == auVar95._4_4_) & uVar59,
                              -(uint)(auVar92._0_4_ == auVar95._0_4_) & uVar58);
                auVar76._8_4_ = -(uint)(auVar92._8_4_ == auVar95._8_4_) & uVar62;
                auVar76._12_4_ = -(uint)(auVar92._12_4_ == auVar95._12_4_) & uVar66;
                iVar42 = movmskps((int)&local_1291,auVar76);
                if (iVar42 != 0) {
                  auVar112._8_4_ = auVar76._8_4_;
                  auVar112._0_8_ = auVar76._0_8_;
                  auVar112._12_4_ = auVar76._12_4_;
                }
                uVar50 = movmskps(iVar42,auVar112);
                uVar44 = CONCAT44((int)((ulong)&local_1291 >> 0x20),uVar50);
                pRVar57 = (RayHit *)0x0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> (long)pRVar57 & 1) == 0;
                      pRVar57 = (RayHit *)((long)(pRVar57->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                do {
                  uVar58 = *(uint *)((long)&local_f88 + (long)pRVar57 * 4);
                  pGVar29 = (pSVar41->geometries).items[uVar58].ptr;
                  if ((pGVar29->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1228 + (long)pRVar57 * 4) = 0;
                  }
                  else {
                    pRVar32 = context->args;
                    if ((pRVar32->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar70 = *(float *)(local_10a8 + (long)pRVar57 * 4);
                      fVar131 = *(float *)(local_1098 + (long)pRVar57 * 4);
                      (ray->super_RayK<1>).tfar = local_1088[(long)pRVar57];
                      (ray->Ng).field_0.field_0.x = local_1078[(long)pRVar57];
                      (ray->Ng).field_0.field_0.y = local_1068[(long)pRVar57];
                      (ray->Ng).field_0.field_0.z = *(float *)(local_1058 + (long)pRVar57 * 4);
                      ray->u = fVar70;
                      ray->v = fVar131;
                      ray->primID = *(uint *)((long)&local_1108 + (long)pRVar57 * 4);
                      ray->geomID = uVar58;
                      pRVar33 = context->user;
                      ray->instID[0] = pRVar33->instID[0];
                      ray->instPrimID[0] = pRVar33->instPrimID[0];
                      break;
                    }
                    local_1218.context = context->user;
                    local_1158 = local_1078[(long)pRVar57];
                    local_1154 = local_1068[(long)pRVar57];
                    local_1150 = *(undefined4 *)(local_1058 + (long)pRVar57 * 4);
                    local_114c = *(undefined4 *)(local_10a8 + (long)pRVar57 * 4);
                    local_1148 = *(undefined4 *)(local_1098 + (long)pRVar57 * 4);
                    local_1144 = *(undefined4 *)((long)&local_1108 + (long)pRVar57 * 4);
                    local_1140 = uVar58;
                    local_113c = (local_1218.context)->instID[0];
                    local_1138 = (local_1218.context)->instPrimID[0];
                    local_1268 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = local_1088[(long)pRVar57];
                    local_124c._0_4_ = -NAN;
                    local_1218.valid = (int *)local_124c;
                    local_1218.geometryUserPtr = pGVar29->userPtr;
                    local_1218.ray = (RTCRayN *)ray;
                    local_1218.hit = (RTCHitN *)&local_1158;
                    local_1218.N = 1;
                    fVar70 = (float)local_1288._0_4_;
                    fVar131 = (float)local_1288._4_4_;
                    fVar152 = fStack_1280;
                    fVar148 = fStack_127c;
                    if (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00df16c3:
                      if (pRVar32->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar32->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar29->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar32->filter)(&local_1218);
                          fVar70 = (float)local_1288._0_4_;
                          fVar131 = (float)local_1288._4_4_;
                          fVar152 = fStack_1280;
                          fVar148 = fStack_127c;
                        }
                        if (*local_1218.valid == 0) goto LAB_00df179d;
                      }
                      (((Vec3f *)((long)local_1218.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1218.hit;
                      (((Vec3f *)((long)local_1218.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1218.hit + 4);
                      (((Vec3f *)((long)local_1218.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1218.hit + 8);
                      *(float *)((long)local_1218.ray + 0x3c) = *(float *)(local_1218.hit + 0xc);
                      *(float *)((long)local_1218.ray + 0x40) = *(float *)(local_1218.hit + 0x10);
                      *(float *)((long)local_1218.ray + 0x44) = *(float *)(local_1218.hit + 0x14);
                      *(float *)((long)local_1218.ray + 0x48) = *(float *)(local_1218.hit + 0x18);
                      *(float *)((long)local_1218.ray + 0x4c) = *(float *)(local_1218.hit + 0x1c);
                      *(float *)((long)local_1218.ray + 0x50) = *(float *)(local_1218.hit + 0x20);
                      pRVar45 = (RayHit *)local_1218.ray;
                    }
                    else {
                      (*pGVar29->intersectionFilterN)(&local_1218);
                      fVar70 = (float)local_1288._0_4_;
                      fVar131 = (float)local_1288._4_4_;
                      fVar152 = fStack_1280;
                      fVar148 = fStack_127c;
                      if (*local_1218.valid != 0) goto LAB_00df16c3;
LAB_00df179d:
                      (ray->super_RayK<1>).tfar = local_1268;
                      pRVar45 = (RayHit *)local_1218.valid;
                    }
                    uVar58 = (uint)pRVar45;
                    *(undefined4 *)(local_1228 + (long)pRVar57 * 4) = 0;
                    fVar102 = (ray->super_RayK<1>).tfar;
                    local_1228._0_4_ = -(uint)(fVar70 <= fVar102) & local_1228._0_4_;
                    local_1228._4_4_ = -(uint)(fVar131 <= fVar102) & local_1228._4_4_;
                    local_1228._8_4_ = -(uint)(fVar152 <= fVar102) & local_1228._8_4_;
                    local_1228._12_4_ = -(uint)(fVar148 <= fVar102) & local_1228._12_4_;
                    local_1288._0_4_ = fVar70;
                    local_1288._4_4_ = fVar131;
                    fStack_1280 = fVar152;
                    fStack_127c = fVar148;
                  }
                  iVar42 = movmskps(uVar58,local_1228);
                  if (iVar42 == 0) break;
                  BVHNIntersector1<4,16777232,true,embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Pluecker<4,true>>>
                  ::intersect();
                  pRVar57 = (RayHit *)local_1218.valid;
                } while( true );
              }
            }
            local_1160 = local_1160 + 1;
          } while (local_1160 != local_1170);
        }
        fVar70 = (ray->super_RayK<1>).tfar;
        auVar139._4_4_ = fVar70;
        auVar139._0_4_ = fVar70;
        auVar139._8_4_ = fVar70;
        auVar139._12_4_ = fVar70;
        uVar44 = local_1190;
        uVar46 = local_11a8;
        uVar47 = local_1270;
        This = local_1278;
        uVar48 = local_1188;
        uVar49 = local_1198;
        uVar51 = local_11a0;
        auVar92 = local_ff8;
        fVar70 = local_1018;
        fVar131 = fStack_1014;
        fVar152 = fStack_1010;
        fVar148 = fStack_100c;
        fVar102 = local_1028;
        fVar77 = fStack_1024;
        fVar82 = fStack_1020;
        fVar83 = fStack_101c;
        fVar84 = local_1038;
        fVar90 = fStack_1034;
        fVar91 = fStack_1030;
        fVar96 = fStack_102c;
        fVar97 = local_1048;
        fVar98 = fStack_1044;
        fVar99 = fStack_1040;
        fVar100 = fStack_103c;
        fVar101 = local_11e8;
        fVar103 = fStack_11e4;
        fVar113 = fStack_11e0;
        fVar114 = fStack_11dc;
        fVar115 = local_1118;
        fVar116 = fStack_1114;
        fVar117 = fStack_1110;
        fVar118 = fStack_110c;
        fVar119 = local_1128;
        fVar124 = fStack_1124;
        fVar125 = fStack_1120;
        fVar129 = fStack_111c;
        fVar130 = local_fe8;
        fVar132 = fStack_fe4;
        fVar134 = fStack_fe0;
        fVar135 = fStack_fdc;
        fVar136 = local_1008;
        fVar137 = fStack_1004;
        fVar141 = fStack_1000;
        fVar142 = fStack_ffc;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }